

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O2

int Aig_ManPropagateBuffers(Aig_Man_t *p,int fUpdateLevel)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  long lVar4;
  void **ppvVar5;
  int iVar6;
  Aig_Obj_t *pObj;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x1b4,"int Aig_ManPropagateBuffers(Aig_Man_t *, int)");
  }
  iVar6 = 0;
LAB_0057b6c9:
  lVar4 = (long)p->vBufs->nSize;
  if (lVar4 < 1) {
    return iVar6;
  }
  ppvVar5 = p->vBufs->pArray + lVar4 + -1;
  do {
    pObj = (Aig_Obj_t *)*ppvVar5;
    do {
      if ((*(uint *)&pObj->field_0x18 & 7) != 4) {
        Aig_NodeFixBufferFanins(p,pObj,fUpdateLevel);
        if (iVar6 == 0xf4241) {
          puts("Error: A cycle is encountered while propagating buffers.");
          return 0xf4241;
        }
        iVar6 = iVar6 + 1;
        goto LAB_0057b6c9;
      }
      if ((p->pFanData == (int *)0x0) || (piVar1 = &pObj->Id, p->nFansAlloc <= *piVar1)) {
        __assert_fail("p->pFanData && pObj->Id < p->nFansAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x147,"Aig_Obj_t *Aig_ObjFanout0(Aig_Man_t *, Aig_Obj_t *)");
      }
      pVVar2 = p->vObjs;
      pObj = (Aig_Obj_t *)0x0;
    } while (pVVar2 == (Vec_Ptr_t *)0x0);
    uVar3 = p->pFanData[(long)*piVar1 * 5] >> 1;
    if (((int)uVar3 < 0) || (pVVar2->nSize <= (int)uVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    ppvVar5 = pVVar2->pArray + uVar3;
  } while( true );
}

Assistant:

int Aig_ManPropagateBuffers( Aig_Man_t * p, int fUpdateLevel )
{
    Aig_Obj_t * pObj;
    int nSteps;
    assert( p->pFanData );
    for ( nSteps = 0; Vec_PtrSize(p->vBufs) > 0; nSteps++ )
    {
        // get the node with a buffer fanin
        for ( pObj = (Aig_Obj_t *)Vec_PtrEntryLast(p->vBufs); Aig_ObjIsBuf(pObj); pObj = Aig_ObjFanout0(p, pObj) );
        // replace this node by a node without buffer
        Aig_NodeFixBufferFanins( p, pObj, fUpdateLevel );
        // stop if a cycle occured
        if ( nSteps > 1000000 )
        {
            printf( "Error: A cycle is encountered while propagating buffers.\n" );
            break;
        }
    }
    return nSteps;
}